

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt.cpp
# Opt level: O2

void opt_Parse(char *s)

{
  char cVar1;
  int iVar2;
  char *in_RAX;
  size_t sVar3;
  ulong newDepth;
  bool *pbVar4;
  int *piVar5;
  uint uVar6;
  char *pcVar7;
  char *endptr;
  
  cVar1 = *s;
  endptr = in_RAX;
  switch(cVar1) {
  case 'g':
    sVar3 = strlen(s + 1);
    if (sVar3 == 4) {
      opt_G(s + 1);
      return;
    }
    pcVar7 = "Must specify exactly 4 characters for option \'g\'\n";
    break;
  case 'h':
    if (s[1] == '\0') {
      pbVar4 = &haltNop;
LAB_0010f52d:
      *pbVar4 = false;
      return;
    }
    pcVar7 = "Option \'h\' does not take an argument\n";
    break;
  case 'l':
    if (s[1] == '\0') {
      pbVar4 = &warnOnLdOpt;
      goto LAB_0010f52d;
    }
    pcVar7 = "Option \'l\' does not take an argument\n";
    break;
  case 'p':
    sVar3 = strlen(s + 1);
    if (sVar3 < 3) {
      iVar2 = __isoc99_sscanf(s + 1,"%x",&endptr);
      if (iVar2 == 1) {
        if ((uint)endptr < 0x100) {
          fillByte = (uint8_t)(uint)endptr;
          return;
        }
        pcVar7 = "Argument for option \'p\' must be between 0 and 0xFF\n";
      }
      else {
        pcVar7 = "Invalid argument for option \'p\'\n";
      }
LAB_0010f56e:
      error(pcVar7);
      return;
    }
    pcVar7 = "Invalid argument for option \'p\'\n";
    break;
  case 'r':
    do {
      cVar1 = s[1];
      s = s + 1;
      iVar2 = isblank((int)cVar1);
    } while (iVar2 != 0);
    if (cVar1 != '\0') {
      newDepth = strtoul(s,&endptr,10);
      if (*endptr == '\0') {
        piVar5 = __errno_location();
        if (*piVar5 != 0x22) {
          opt_R(newDepth);
          return;
        }
        pcVar7 = "Argument to \'r\' is out of range (\"%s\")\n";
      }
      else {
        pcVar7 = "Invalid argument to option \'r\' (\"%s\")\n";
      }
      error(pcVar7,s);
      return;
    }
    pcVar7 = "Missing argument to option \'r\'\n";
    break;
  default:
    if (cVar1 == '!') {
      uVar6 = (uint)s[1];
      switch(uVar6 << 0x1e | uVar6 - 0x48 >> 2) {
      case 0:
        if (s[2] == '\0') {
          pbVar4 = &warnOnHaltNop;
LAB_0010f604:
          *pbVar4 = true;
          return;
        }
        pcVar7 = "Option \'!H\' does not take an argument\n";
        break;
      case 1:
        if (s[2] == '\0') {
          pbVar4 = &optimizeLoads;
          goto LAB_0010f604;
        }
        pcVar7 = "Option \'!L\' does not take an argument\n";
        break;
      default:
        pcVar7 = "Unknown option \'!%c\'\n";
        goto LAB_0010f368;
      case 8:
        if (s[2] == '\0') {
          pbVar4 = &haltNop;
          goto LAB_0010f604;
        }
        pcVar7 = "Option \'!h\' does not take an argument\n";
        break;
      case 9:
        if (s[2] == '\0') {
          pbVar4 = &warnOnLdOpt;
          goto LAB_0010f604;
        }
        pcVar7 = "Option \'!l\' does not take an argument\n";
      }
      break;
    }
    if (cVar1 == 'H') {
      if (s[1] == '\0') {
        pbVar4 = &warnOnHaltNop;
        goto LAB_0010f52d;
      }
      pcVar7 = "Option \'H\' does not take an argument\n";
      break;
    }
    if (cVar1 == 'L') {
      if (s[1] == '\0') {
        pbVar4 = &optimizeLoads;
        goto LAB_0010f52d;
      }
      pcVar7 = "Option \'L\' does not take an argument\n";
      break;
    }
    if (cVar1 == 'Q') {
      pcVar7 = s + 1;
      if (s[1] == '.') {
        pcVar7 = s + 2;
      }
      sVar3 = strlen(pcVar7);
      if (sVar3 < 3) {
        iVar2 = __isoc99_sscanf(pcVar7,"%u",&endptr);
        if (iVar2 == 1) {
          if (0xffffffe0 < (uint)endptr - 0x20) {
            fixPrecision = (uint8_t)(uint)endptr;
            return;
          }
          pcVar7 = "Argument for option \'Q\' must be between 1 and 31\n";
        }
        else {
          pcVar7 = "Invalid argument for option \'Q\'\n";
        }
        goto LAB_0010f56e;
      }
      pcVar7 = "Invalid argument for option \'Q\'\n";
      break;
    }
    if (cVar1 == 'W') {
      if (s[1] != '\0') {
        processWarningFlag(s + 1);
        return;
      }
      pcVar7 = "Must specify an argument for option \'W\'\n";
      break;
    }
    if (cVar1 == 'b') {
      sVar3 = strlen(s + 1);
      if (sVar3 == 2) {
        binDigits[0] = s[1];
        binDigits[1] = s[2];
        return;
      }
      pcVar7 = "Must specify exactly 2 characters for option \'b\'\n";
      break;
    }
  case 'i':
  case 'j':
  case 'k':
  case 'm':
  case 'n':
  case 'o':
  case 'q':
    uVar6 = (uint)cVar1;
    pcVar7 = "Unknown option \'%c\'\n";
LAB_0010f368:
    error(pcVar7,(ulong)uVar6);
    return;
  }
  error(pcVar7);
  return;
}

Assistant:

void opt_Parse(char *s)
{
	switch (s[0]) {
	case 'b':
		if (strlen(&s[1]) == 2)
			opt_B(&s[1]);
		else
			error("Must specify exactly 2 characters for option 'b'\n");
		break;

	case 'g':
		if (strlen(&s[1]) == 4)
			opt_G(&s[1]);
		else
			error("Must specify exactly 4 characters for option 'g'\n");
		break;

	case 'p':
		if (strlen(&s[1]) <= 2) {
			int result;
			unsigned int padByte;

			result = sscanf(&s[1], "%x", &padByte);
			if (result != 1)
				error("Invalid argument for option 'p'\n");
			else if (padByte > 0xFF)
				error("Argument for option 'p' must be between 0 and 0xFF\n");
			else
				opt_P(padByte);
		} else {
			error("Invalid argument for option 'p'\n");
		}
		break;

		const char *precisionArg;
	case 'Q':
		precisionArg = &s[1];
		if (precisionArg[0] == '.')
			precisionArg++;
		if (strlen(precisionArg) <= 2) {
			int result;
			unsigned int precision;

			result = sscanf(precisionArg, "%u", &precision);
			if (result != 1)
				error("Invalid argument for option 'Q'\n");
			else if (precision < 1 || precision > 31)
				error("Argument for option 'Q' must be between 1 and 31\n");
			else
				opt_Q(precision);
		} else {
			error("Invalid argument for option 'Q'\n");
		}
		break;

	case 'r': {
		++s; // Skip 'r'
		while (isblank(*s))
			++s; // Skip leading whitespace

		if (s[0] == '\0') {
			error("Missing argument to option 'r'\n");
			break;
		}

		char *endptr;
		unsigned long newDepth = strtoul(s, &endptr, 10);

		if (*endptr != '\0') {
			error("Invalid argument to option 'r' (\"%s\")\n", s);
		} else if (errno == ERANGE) {
			error("Argument to 'r' is out of range (\"%s\")\n", s);
		} else {
			opt_R(newDepth);
		}
		break;
	}

	case 'H':
		if (s[1] == '\0')
			opt_H(false);
		else
			error("Option 'H' does not take an argument\n");
		break;

	case 'h':
		if (s[1] == '\0')
			opt_h(false);
		else
			error("Option 'h' does not take an argument\n");
		break;

	case 'L':
		if (s[1] == '\0')
			opt_L(false);
		else
			error("Option 'L' does not take an argument\n");
		break;

	case 'l':
		if (s[1] == '\0')
			opt_l(false);
		else
			error("Option 'l' does not take an argument\n");
		break;

	case 'W':
		if (strlen(&s[1]) > 0)
			opt_W(&s[1]);
		else
			error("Must specify an argument for option 'W'\n");
		break;

	case '!': // negates flag options that do not take an argument
		switch (s[1]) {
		case 'H':
			if (s[2] == '\0')
				opt_H(true);
			else
				error("Option '!H' does not take an argument\n");
			break;

		case 'h':
			if (s[2] == '\0')
				opt_h(true);
			else
				error("Option '!h' does not take an argument\n");
			break;

		case 'L':
			if (s[2] == '\0')
				opt_L(true);
			else
				error("Option '!L' does not take an argument\n");
			break;

		case 'l':
			if (s[2] == '\0')
				opt_l(true);
			else
				error("Option '!l' does not take an argument\n");
			break;

		default:
			error("Unknown option '!%c'\n", s[1]);
			break;
		}
		break;

	default:
		error("Unknown option '%c'\n", s[0]);
		break;
	}
}